

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O1

polynomial_t polynomial_create_from_roots(field_t field,uint nroots,field_element_t *roots)

{
  polynomial_t res;
  field_t field_00;
  field_element_t *__ptr;
  field_element_t *pfVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  polynomial_t pVar6;
  polynomial_t l;
  polynomial_t r_00;
  polynomial_t r [2];
  field_element_t *local_98;
  void *local_90 [4];
  ulong local_70;
  field_element_t *local_68;
  field_logarithm_t *local_60;
  void *local_58;
  field_element_t *local_50;
  ulong local_48;
  field_element_t *local_40;
  ulong local_38;
  
  local_60 = field.log;
  local_68 = field.exp;
  uVar2 = (ulong)(nroots + 1);
  local_40 = (field_element_t *)malloc(uVar2);
  uVar5 = 1;
  __ptr = (field_element_t *)calloc(2,1);
  pfVar1 = (field_element_t *)calloc(uVar2,1);
  local_98 = pfVar1;
  local_48 = uVar2;
  local_58 = calloc(uVar2,1);
  local_90[1] = local_58;
  *pfVar1 = *roots;
  local_50 = pfVar1;
  pfVar1[1] = '\x01';
  local_90[0]._0_4_ = 1;
  __ptr[1] = '\x01';
  uVar3 = 0;
  uVar2 = (ulong)nroots;
  if (1 < nroots) {
    local_70 = (ulong)nroots;
    local_38 = (ulong)nroots;
    field_00.log = local_60;
    field_00.exp = local_68;
    uVar4 = 0;
    do {
      *__ptr = roots[uVar5];
      uVar3 = ~(uint)uVar4 & 1;
      uVar5 = uVar5 + 1;
      uVar2 = (ulong)(uVar3 << 4);
      *(int *)((long)local_90 + uVar2) = (int)uVar5;
      res._8_8_ = *(undefined8 *)((long)local_90 + uVar2);
      res.coeff = *(field_element_t **)((long)local_90 + (uVar2 - 8));
      l._8_8_ = 1;
      l.coeff = __ptr;
      r_00.order = *(undefined4 *)(local_90 + uVar4 * 2);
      r_00.coeff = (field_element_t *)local_90[uVar4 * 2 + -1];
      r_00._12_4_ = 0;
      polynomial_mul(field_00,l,r_00,res);
      uVar4 = (ulong)uVar3;
      uVar2 = local_70;
    } while (local_38 != uVar5);
  }
  pfVar1 = local_40;
  memcpy(local_40,*(void **)((long)local_90 + ((ulong)(uVar3 << 4) - 8)),local_48);
  free(__ptr);
  free(local_50);
  free(local_58);
  pVar6._8_8_ = uVar2 & 0xffffffff;
  pVar6.coeff = pfVar1;
  return pVar6;
}

Assistant:

polynomial_t polynomial_create_from_roots(field_t field, unsigned int nroots, field_element_t *roots) {
    polynomial_t poly = polynomial_create(nroots);
    unsigned int order = nroots;
    polynomial_t l;
    l.order = 1;
    l.coeff = calloc(2, sizeof(field_element_t));

    polynomial_t r[2];
    // we'll keep two temporary stores of rightside polynomial
    // each time through the loop, we take the previous result and use it as new rightside
    // swap back and forth (prevents the need for a copy)
    r[0].coeff = calloc(order + 1, sizeof(field_element_t));
    r[1].coeff = calloc(order + 1, sizeof(field_element_t));
    unsigned int rcoeffres = 0;

    // initialize the result with x + roots[0]
    r[rcoeffres].coeff[0] = roots[0];
    r[rcoeffres].coeff[1] = 1;
    r[rcoeffres].order = 1;

    // initialize lcoeff[1] with x
    // we'll fill in the 0th order term in each loop iter
    l.coeff[1] = 1;

    // loop through, using previous run's result as the new right hand side
    // this allows us to multiply one group at a time
    for (unsigned int i = 1; i < nroots; i++) {
        l.coeff[0] = roots[i];
        unsigned int nextrcoeff = rcoeffres;
        rcoeffres = (rcoeffres + 1) % 2;
        r[rcoeffres].order = i + 1;
        polynomial_mul(field, l, r[nextrcoeff], r[rcoeffres]);
    }

    memcpy(poly.coeff, r[rcoeffres].coeff, (order + 1) * sizeof(field_element_t));
    poly.order = order;

    free(l.coeff);
    free(r[0].coeff);
    free(r[1].coeff);

    return poly;
}